

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O3

string * __thiscall Production::toStr_abi_cxx11_(string *__return_storage_ptr__,Production *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pcVar3;
  long *plVar4;
  size_type *psVar5;
  long lVar6;
  pointer pbVar7;
  char *__end;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> state;
  string uniqueID;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"","");
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"","");
  std::operator+(&local_78,"#PROD.FROM#\n",&this->fromP);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_78);
  paVar1 = &local_98.field_2;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_98.field_2._M_allocated_capacity = *psVar5;
    local_98.field_2._8_8_ = plVar4[3];
    local_98._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar5;
    local_98._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_98._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_98._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  pbVar7 = (this->toP).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->toP).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar7 != pbVar2) {
    lVar6 = 1;
    do {
      pcVar3 = (pbVar7->_M_dataplus)._M_p;
      local_98._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,pcVar3,pcVar3 + pbVar7->_M_string_length);
      std::operator+(&local_78,"#PROD.STATE#\n",&local_98);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_78._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if (lVar6 != (long)(this->toP).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->toP).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      pbVar7 = pbVar7 + 1;
      lVar6 = lVar6 + 1;
    } while (pbVar7 != pbVar2);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Production::toStr() {
    std::string uniqueID = "";
    std::string returnStr = "";

    // from
    returnStr += "#PROD.FROM#\n" + fromP + "\n";
    returnStr += "#PROD.STATES#\n";

    // to
    int i = 0;
    for (auto state: toP) {
        i++;
        returnStr += "#PROD.STATE#\n" + state;
        if (i != toP.size()) {
            returnStr += "\n";
        }
    }

    return returnStr;
}